

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NormalMap.cpp
# Opt level: O0

FloatImage * nv::createNormalMap(Image *img,WrapMode wm,Arg heightWeights,NormalMapFilter filter)

{
  int iVar1;
  Kernel2 *this;
  FloatImage *pFVar2;
  Kernel2 *kdv;
  Kernel2 *kdu;
  NormalMapFilter filter_local;
  Arg heightWeights_local;
  WrapMode wm_local;
  Image *img_local;
  
  if ((img == (Image *)0x0) &&
     (iVar1 = nvAbort("img != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/NormalMap.cpp"
                      ,0x51,
                      "FloatImage *nv::createNormalMap(const Image *, FloatImage::WrapMode, Vector4::Arg, NormalMapFilter)"
                     ), iVar1 == 1)) {
    raise(5);
  }
  kdv = (Kernel2 *)0x0;
  switch(filter) {
  case NormalMapFilter_Sobel3x3:
    kdv = (Kernel2 *)operator_new(0x10);
    Kernel2::Kernel2(kdv,3);
    break;
  case NormalMapFilter_Sobel5x5:
    kdv = (Kernel2 *)operator_new(0x10);
    Kernel2::Kernel2(kdv,5);
    break;
  case NormalMapFilter_Sobel7x7:
    kdv = (Kernel2 *)operator_new(0x10);
    Kernel2::Kernel2(kdv,7);
    break;
  case NormalMapFilter_Sobel9x9:
    kdv = (Kernel2 *)operator_new(0x10);
    Kernel2::Kernel2(kdv,9);
  }
  Kernel2::initSobel(kdv);
  Kernel2::normalize(kdv);
  this = (Kernel2 *)operator_new(0x10);
  Kernel2::Kernel2(this,kdv);
  Kernel2::transpose(this);
  pFVar2 = ::createNormalMap(img,wm,heightWeights,kdv,this);
  return pFVar2;
}

Assistant:

FloatImage * nv::createNormalMap(const Image * img, FloatImage::WrapMode wm, Vector4::Arg heightWeights, NormalMapFilter filter /*= Sobel3x3*/)
{
	nvCheck(img != NULL);
	
	// Init the kernels.
	Kernel2 * kdu = NULL;
	Kernel2 * kdv = NULL;

	switch(filter)
	{
		case NormalMapFilter_Sobel3x3:
			kdu = new Kernel2(3);
			break;
		case NormalMapFilter_Sobel5x5:
			kdu = new Kernel2(5);
			break;
		case NormalMapFilter_Sobel7x7:
			kdu = new Kernel2(7);
			break;
		case NormalMapFilter_Sobel9x9:
			kdu = new Kernel2(9);
			break;
		default:
			nvDebugCheck(false);
	};

	kdu->initSobel();
	kdu->normalize();

	kdv = new Kernel2(*kdu);
	kdv->transpose();

	return ::createNormalMap(img, wm, heightWeights, kdu, kdv);
}